

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O3

void __thiscall Test::Suite::testFailed(Suite *this,Assertion *assertion)

{
  this->currentTestSucceeded = false;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&assertion->method,&this->currentTestMethodName);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&assertion->args,&this->currentTestMethodArgs);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&assertion->suite,&this->suiteName);
  (*this->output->_vptr_Output[8])(this->output,assertion);
  return;
}

Assistant:

void Suite::testFailed(Assertion &&assertion) {
  currentTestSucceeded = false;
  assertion.method = currentTestMethodName;
  assertion.args = currentTestMethodArgs;
  assertion.suite = suiteName;
  output->printFailure(assertion);
}